

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ewmh.c
# Opt level: O0

void ewmh_update_desktop_viewport(natwm_state *state,monitor_list *list)

{
  int iVar1;
  ulong uVar2;
  xcb_rectangle_t monitor_00;
  xcb_ewmh_connection_t *pxVar3;
  long lVar4;
  long lVar5;
  undefined8 uStack_88;
  undefined8 auStack_80 [2];
  natwm_state *local_70;
  monitor_list *local_68;
  long local_60;
  xcb_rectangle_t local_50;
  xcb_rectangle_t rect;
  monitor *monitor;
  node *monitor_item;
  size_t index;
  unsigned_long __vla_expr0;
  size_t num_monitors;
  monitor_list *list_local;
  natwm_state *state_local;
  
  auStack_80[0] = 0x10b425;
  uVar2 = list->monitors->size;
  lVar4 = -(uVar2 * 8 + 0xf & 0xfffffffffffffff0);
  local_60 = (long)auStack_80 + lVar4;
  monitor_item = (node *)0x0;
  local_70 = state;
  local_68 = list;
  for (monitor = (monitor *)list->monitors->head; lVar5 = local_60, monitor != (monitor *)0x0;
      monitor = *(monitor **)monitor) {
    monitor_00 = *(xcb_rectangle_t *)&(monitor->offsets).bottom;
    rect = monitor_00;
    *(undefined8 *)((long)&uStack_88 + lVar4) = 0x10b4a0;
    local_50 = monitor_get_offset_rect((monitor *)monitor_00);
    *(int *)(local_60 + (long)monitor_item * 8) = (int)local_50.x;
    *(int *)(local_60 + 4 + (long)monitor_item * 8) = (int)local_50.y;
    monitor_item = (node *)((long)&monitor_item->next + 1);
  }
  pxVar3 = state->ewmh;
  iVar1 = state->screen_num;
  *(undefined8 *)((long)&uStack_88 + lVar4) = 0x10b4f8;
  xcb_ewmh_set_desktop_viewport(pxVar3,iVar1,uVar2 & 0xffffffff,lVar5);
  return;
}

Assistant:

void ewmh_update_desktop_viewport(const struct natwm_state *state, const struct monitor_list *list)
{
        size_t num_monitors = list->monitors->size;
        xcb_ewmh_coordinates_t viewports[num_monitors];
        size_t index = 0;

        LIST_FOR_EACH(list->monitors, monitor_item)
        {
                struct monitor *monitor = (struct monitor *)monitor_item->data;
                xcb_rectangle_t rect = monitor_get_offset_rect(monitor);

                viewports[index].x = (uint32_t)rect.x;
                viewports[index].y = (uint32_t)rect.y;

                ++index;
        }

        xcb_ewmh_set_desktop_viewport(
                state->ewmh, state->screen_num, (uint32_t)num_monitors, viewports);
}